

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
          (ConnectionCounter *this)

{
  Disposer *pDVar1;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  _Map_pointer ppOVar3;
  uint uVar4;
  int iVar5;
  _Elt_pointer pOVar6;
  ConcurrencyLimitingHttpClient *this_00;
  ConnectionCounter local_30;
  
  this_00 = this->parent;
  if (this_00 != (ConcurrencyLimitingHttpClient *)0x0) {
    uVar4 = this_00->concurrentRequests - 1;
    this_00->concurrentRequests = uVar4;
    if (uVar4 < this_00->maxConcurrentRequests) {
      do {
        pOVar6 = (this_00->pendingRequests).c.
                 super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if ((this_00->pendingRequests).c.
            super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur == pOVar6) break;
        pDVar1 = pOVar6->disposer;
        pPVar2 = pOVar6->ptr;
        pOVar6->ptr = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                       *)0x0;
        if (pOVar6 == (this_00->pendingRequests).c.
                      super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete((this_00->pendingRequests).c.
                          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          ppOVar3 = (this_00->pendingRequests).c.
                    super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          (this_00->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = ppOVar3 + 1;
          pOVar6 = ppOVar3[1];
          (this_00->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = pOVar6;
          (this_00->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = pOVar6 + 0x20;
        }
        else {
          pOVar6 = pOVar6 + 1;
        }
        (this_00->pendingRequests).c.
        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = pOVar6;
        iVar5 = (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[1])(pPVar2);
        if ((char)iVar5 != '\0') {
          this_00->concurrentRequests = this_00->concurrentRequests + 1;
          local_30.parent = this_00;
          (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_30);
          ~ConnectionCounter(&local_30);
        }
        (**pDVar1->_vptr_Disposer)
                  (pDVar1,(_func_int *)
                          ((long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector +
                          (long)(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2]));
      } while (this_00->concurrentRequests < this_00->maxConcurrentRequests);
      this_00 = this->parent;
    }
    fireCountChanged(this_00);
  }
  return;
}

Assistant:

~ConnectionCounter() noexcept(false) {
      if (parent != nullptr) {
        --parent->concurrentRequests;
        parent->serviceQueue();
        parent->fireCountChanged();
      }
    }